

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pseudo-types.cpp
# Opt level: O1

int __thiscall
yactfr::internal::PseudoVarType::clone
          (PseudoVarType *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  PseudoVarType *this_00;
  void *__child_stack_00;
  _Head_base<0UL,_const_yactfr::MapItem_*,_false> local_88;
  __uniq_ptr_impl<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_> local_80;
  PseudoNamedDts local_78;
  undefined1 local_60 [72];
  
  _clonePseudoOpts(&local_78,(PseudoVarType *)__fn);
  if (*(__fn **)(__fn + 0x30) == (__fn *)0x0) {
    local_88._M_head_impl = (MapItem *)0x0;
  }
  else {
    MapItem::clone((MapItem *)local_60,*(__fn **)(__fn + 0x30),__child_stack_00,__flags,__arg);
    local_88._M_head_impl = (MapItem *)local_60._0_8_;
    local_60._0_8_ = (MapItem *)0x0;
    std::unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_>::~unique_ptr
              ((unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_> *)
               local_60);
  }
  this_00 = (PseudoVarType *)operator_new(0xc0);
  local_60._0_8_ = local_60._0_8_ & 0xffffffffffffff00;
  if (__fn[0x50] == (__fn)0x1) {
    local_60._16_4_ = *(undefined4 *)(__fn + 0x60);
    local_60._8_8_ = *(type *)(__fn + 0x58);
    std::
    vector<boost::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::vector((vector<boost::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)(local_60 + 0x18),
             (vector<boost::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)(__fn + 0x68));
    local_60._64_8_ = *(undefined8 *)(__fn + 0x90);
    local_60._48_8_ = *(undefined8 *)(__fn + 0x80);
    local_60._56_8_ = *(undefined8 *)(__fn + 0x88);
    local_60[0] = 1;
  }
  local_80._M_t.
  super__Tuple_impl<0UL,_const_yactfr::MapItem_*,_std::default_delete<const_yactfr::MapItem>_>.
  super__Head_base<0UL,_const_yactfr::MapItem_*,_false>._M_head_impl =
       (tuple<const_yactfr::MapItem_*,_std::default_delete<const_yactfr::MapItem>_>)
       (tuple<const_yactfr::MapItem_*,_std::default_delete<const_yactfr::MapItem>_>)
       local_88._M_head_impl;
  local_88._M_head_impl = (MapItem *)0x0;
  PseudoVarType(this_00,(optional<yactfr::internal::PseudoDataLoc> *)local_60,&local_78,
                (Up *)&local_80,*(TextLocation *)(__fn + 8));
  std::unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_>::~unique_ptr
            ((unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_> *)
             &local_80);
  if ((bool)local_60[0] == true) {
    std::
    vector<boost::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector((vector<boost::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)(local_60 + 0x18));
    local_60._0_8_ = local_60._0_8_ & 0xffffffffffffff00;
  }
  (this->super_PseudoDt)._vptr_PseudoDt = (_func_int **)this_00;
  std::unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_>::~unique_ptr
            ((unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_> *)
             &local_88);
  std::
  vector<std::unique_ptr<yactfr::internal::PseudoNamedDt,_std::default_delete<yactfr::internal::PseudoNamedDt>_>,_std::allocator<std::unique_ptr<yactfr::internal::PseudoNamedDt,_std::default_delete<yactfr::internal::PseudoNamedDt>_>_>_>
  ::~vector(&local_78);
  return (int)this;
}

Assistant:

PseudoDt::Up PseudoVarType::clone() const
{
   return std::make_unique<PseudoVarType>(_pseudoSelLoc, this->_clonePseudoOpts(),
                                          tryCloneAttrs(this->attrs()), this->loc());
}